

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O0

Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> * __thiscall
Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>::replaceTerms
          (Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *this,PolyNf *simplifiedTerms)

{
  uint uVar1;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar2;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *in_RSI;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_RDI;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *monom;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *__end0;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *__begin0;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *__range2;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> out;
  int offs;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *elem;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *this_00;
  Numeral *numeral;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_ffffffffffffff10;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_ffffffffffffff28;
  PolyNf *in_stack_ffffffffffffff70;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_ffffffffffffff78;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *in_stack_ffffffffffffff88
  ;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_ffffffffffffff90;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_60;
  Numeral local_40;
  int local_1c;
  
  local_1c = 0;
  numeral = &local_40;
  elem = in_RDI;
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Stack
            (in_RSI,(size_t)in_RDI);
  nSummands((Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x7561e4);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::reserve
            ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)
             in_stack_ffffffffffffff10,(size_t)numeral);
  this_00 = in_RSI;
  local_60 = Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::begin
                       (in_RSI);
  pMVar2 = Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::end(in_RSI)
  ;
  for (; local_60 != pMVar2; local_60 = local_60 + 1) {
    in_stack_ffffffffffffff90 = local_60;
    RationalConstantType::RationalConstantType((RationalConstantType *)this_00,&elem->numeral);
    Lib::
    Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
    ::operator->(&in_stack_ffffffffffffff90->factors);
    MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>::replaceTerms
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    Lib::
    perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>,Lib::PerfectIdComparison>
              (in_stack_ffffffffffffff28);
    Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Monom
              (in_stack_ffffffffffffff10,numeral,
               (Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
                *)this_00);
    Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::push(this_00,elem)
    ;
    Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::~Monom
              ((Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x7562e2);
    MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>::~MonomFactors
              ((MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x7562ec);
    RationalConstantType::~RationalConstantType(&in_RDI->numeral);
    Lib::
    Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
    ::operator->(&in_stack_ffffffffffffff90->factors);
    uVar1 = MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>::nFactors
                      ((MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x75630f);
    local_1c = uVar1 + local_1c;
  }
  Polynom((Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)in_stack_ffffffffffffff90,
          in_stack_ffffffffffffff88);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::~Stack
            ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)in_RDI);
  return (Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)elem;
}

Assistant:

Polynom<Number> Polynom<Number>::replaceTerms(PolyNf* simplifiedTerms) const 
{
  int offs = 0;
  Stack<Monom> out;
  out.reserve(nSummands());

  for (auto& monom : _summands) {
    out.push(Monom(
          monom.numeral, 
          perfect(monom.factors->replaceTerms(&simplifiedTerms[offs]))));
    offs += monom.factors->nFactors();
  }
  return Polynom(std::move(out));
}